

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lru_cache.hpp
# Opt level: O0

bool __thiscall
cappuccino::
lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_(cappuccino::thread_safe)1>
::insert(lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_(cappuccino::thread_safe)1>
         *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,
        unsigned_long value,allow a)

{
  bool bVar1;
  lock_guard<cappuccino::mutex<(cappuccino::thread_safe)1,_std::mutex>_> local_30;
  lock_guard<cappuccino::mutex<(cappuccino::thread_safe)1,_std::mutex>_> guard;
  allow a_local;
  unsigned_long value_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key_local;
  lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
  *this_local;
  
  guard._M_device = (mutex_type *)a;
  a_local = value;
  value_local = (unsigned_long)key;
  key_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  std::lock_guard<cappuccino::mutex<(cappuccino::thread_safe)1,_std::mutex>_>::lock_guard
            (&local_30,(mutex_type *)this);
  bVar1 = do_insert_update(this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )value_local,&a_local,(allow)guard._M_device);
  std::lock_guard<cappuccino::mutex<(cappuccino::thread_safe)1,_std::mutex>_>::~lock_guard
            (&local_30);
  return bVar1;
}

Assistant:

auto insert(const key_type& key, value_type value, allow a = allow::insert_or_update) -> bool
    {
        std::lock_guard guard{m_lock};
        return do_insert_update(key, std::move(value), a);
    }